

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::
MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
::OneQuarterTest(MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
                 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  undefined8 *puVar10;
  aom_bit_depth_t aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined2 uVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint8_t *__s;
  SEARCH_METHODS *message;
  internal in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar44;
  int iVar53;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar54;
  undefined1 auVar52 [16];
  int iVar55;
  int iVar56;
  int iVar59;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar64 [16];
  uint var;
  RegisterStateCheckMMX reg_check_mmx;
  uint expected;
  uint sse;
  AssertHelper AStack_58;
  Message local_50;
  uint local_44;
  RegisterStateCheckMMX local_40;
  uint local_20;
  uint local_1c;
  
  auVar16 = _DAT_00c0d0d0;
  auVar15 = _DAT_00c0d0c0;
  auVar14 = _DAT_00c0d0b0;
  auVar13 = _DAT_00c0d0a0;
  auVar12 = _DAT_00bfdd80;
  iVar44 = (this->params_).block_size;
  sVar18 = (size_t)iVar44;
  local_40.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  if ((this->params_).use_high_bit_depth == false) {
    memset(this->src_,0xff,sVar18);
    sVar18 = (size_t)(iVar44 / 2);
    memset(this->ref_,0xff,sVar18);
    __s = this->ref_ + sVar18;
  }
  else {
    aVar11 = (this->params_).bit_depth;
    if (iVar44 == 0) goto LAB_007b69d0;
    lVar20 = sVar18 - 1;
    auVar22._8_4_ = (int)lVar20;
    auVar22._0_8_ = lVar20;
    auVar22._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar21 = 0;
    auVar22 = auVar22 ^ _DAT_00bfdd80;
    lVar20 = (long)this->src_ * 2;
    do {
      auVar35._8_4_ = (int)uVar21;
      auVar35._0_8_ = uVar21;
      auVar35._12_4_ = (int)(uVar21 >> 0x20);
      auVar27 = (auVar35 | auVar16) ^ auVar12;
      iVar43 = auVar22._0_4_;
      iVar55 = -(uint)(iVar43 < auVar27._0_4_);
      iVar54 = auVar22._4_4_;
      auVar28._4_4_ = -(uint)(iVar54 < auVar27._4_4_);
      iVar53 = auVar22._8_4_;
      iVar59 = -(uint)(iVar53 < auVar27._8_4_);
      iVar56 = auVar22._12_4_;
      auVar28._12_4_ = -(uint)(iVar56 < auVar27._12_4_);
      auVar46._4_4_ = iVar55;
      auVar46._0_4_ = iVar55;
      auVar46._8_4_ = iVar59;
      auVar46._12_4_ = iVar59;
      auVar60 = pshuflw(in_XMM11,auVar46,0xe8);
      auVar30._4_4_ = -(uint)(auVar27._4_4_ == iVar54);
      auVar30._12_4_ = -(uint)(auVar27._12_4_ == iVar56);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar64 = pshuflw(in_XMM12,auVar30,0xe8);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar61 = pshuflw(auVar60,auVar28,0xe8);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar61 | auVar64 & auVar60) ^ auVar27;
      auVar27 = packssdw(auVar27,auVar27);
      uVar17 = (undefined2)(0xff << ((char)aVar11 - AOM_BITS_8 & 0x1f));
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + uVar21 * 2) = uVar17;
      }
      auVar28 = auVar30 & auVar46 | auVar28;
      auVar27 = packssdw(auVar28,auVar28);
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar27 = packssdw(auVar27 ^ auVar61,auVar27 ^ auVar61);
      if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)(lVar20 + 2 + uVar21 * 2) = uVar17;
      }
      auVar27 = (auVar35 | auVar15) ^ auVar12;
      iVar55 = -(uint)(iVar43 < auVar27._0_4_);
      auVar57._4_4_ = -(uint)(iVar54 < auVar27._4_4_);
      iVar59 = -(uint)(iVar53 < auVar27._8_4_);
      auVar57._12_4_ = -(uint)(iVar56 < auVar27._12_4_);
      auVar29._4_4_ = iVar55;
      auVar29._0_4_ = iVar55;
      auVar29._8_4_ = iVar59;
      auVar29._12_4_ = iVar59;
      auVar45._4_4_ = -(uint)(auVar27._4_4_ == iVar54);
      auVar45._12_4_ = -(uint)(auVar27._12_4_ == iVar56);
      auVar45._0_4_ = auVar45._4_4_;
      auVar45._8_4_ = auVar45._12_4_;
      auVar57._0_4_ = auVar57._4_4_;
      auVar57._8_4_ = auVar57._12_4_;
      auVar27 = auVar45 & auVar29 | auVar57;
      auVar27 = packssdw(auVar27,auVar27);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar27 = packssdw(auVar27 ^ auVar1,auVar27 ^ auVar1);
      if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 4 + uVar21 * 2) = uVar17;
      }
      auVar30 = pshufhw(auVar29,auVar29,0x84);
      auVar46 = pshufhw(auVar45,auVar45,0x84);
      auVar28 = pshufhw(auVar30,auVar57,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar28 | auVar46 & auVar30) ^ auVar31;
      auVar30 = packssdw(auVar31,auVar31);
      if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 6 + uVar21 * 2) = uVar17;
      }
      auVar30 = (auVar35 | auVar14) ^ auVar12;
      iVar55 = -(uint)(iVar43 < auVar30._0_4_);
      auVar33._4_4_ = -(uint)(iVar54 < auVar30._4_4_);
      iVar59 = -(uint)(iVar53 < auVar30._8_4_);
      auVar33._12_4_ = -(uint)(iVar56 < auVar30._12_4_);
      auVar47._4_4_ = iVar55;
      auVar47._0_4_ = iVar55;
      auVar47._8_4_ = iVar59;
      auVar47._12_4_ = iVar59;
      auVar27 = pshuflw(auVar27,auVar47,0xe8);
      auVar32._4_4_ = -(uint)(auVar30._4_4_ == iVar54);
      auVar32._12_4_ = -(uint)(auVar30._12_4_ == iVar56);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar30 = pshuflw(auVar64 & auVar60,auVar32,0xe8);
      in_XMM12 = auVar30 & auVar27;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar27 = pshuflw(auVar27,auVar33,0xe8);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar27 | in_XMM12) ^ auVar60;
      in_XMM11 = packssdw(auVar60,auVar60);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 8 + uVar21 * 2) = uVar17;
      }
      auVar33 = auVar32 & auVar47 | auVar33;
      auVar27 = packssdw(auVar33,auVar33);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar27 = packssdw(auVar27 ^ auVar64,auVar27 ^ auVar64);
      if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 10 + uVar21 * 2) = uVar17;
      }
      auVar27 = (auVar35 | auVar13) ^ auVar12;
      iVar43 = -(uint)(iVar43 < auVar27._0_4_);
      auVar48._4_4_ = -(uint)(iVar54 < auVar27._4_4_);
      iVar53 = -(uint)(iVar53 < auVar27._8_4_);
      auVar48._12_4_ = -(uint)(iVar56 < auVar27._12_4_);
      auVar34._4_4_ = iVar43;
      auVar34._0_4_ = iVar43;
      auVar34._8_4_ = iVar53;
      auVar34._12_4_ = iVar53;
      auVar24._4_4_ = -(uint)(auVar27._4_4_ == iVar54);
      auVar24._12_4_ = -(uint)(auVar27._12_4_ == iVar56);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar48._0_4_ = auVar48._4_4_;
      auVar48._8_4_ = auVar48._12_4_;
      auVar27 = auVar24 & auVar34 | auVar48;
      auVar27 = packssdw(auVar27,auVar27);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar27 = packssdw(auVar27 ^ auVar2,auVar27 ^ auVar2);
      if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 0xc + uVar21 * 2) = uVar17;
      }
      auVar35 = pshufhw(auVar34,auVar34,0x84);
      auVar27 = pshufhw(auVar24,auVar24,0x84);
      auVar30 = pshufhw(auVar35,auVar48,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar27 = packssdw(auVar27 & auVar35,(auVar30 | auVar27 & auVar35) ^ auVar3);
      if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar20 + 0xe + uVar21 * 2) = uVar17;
      }
      uVar21 = uVar21 + 8;
    } while ((sVar18 + 7 & 0xfffffffffffffff8) != uVar21);
    if (iVar44 + 1U < 3) goto LAB_007b69d0;
    lVar9 = (long)this->ref_ * 2;
    lVar19 = (long)(iVar44 / 2);
    lVar20 = lVar19 + -1;
    auVar23._8_4_ = (int)lVar20;
    auVar23._0_8_ = lVar20;
    auVar23._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar21 = 0;
    auVar23 = auVar23 ^ auVar12;
    do {
      auVar25._8_4_ = (int)uVar21;
      auVar25._0_8_ = uVar21;
      auVar25._12_4_ = (int)(uVar21 >> 0x20);
      auVar22 = (auVar25 | auVar16) ^ auVar12;
      iVar44 = auVar23._0_4_;
      iVar56 = -(uint)(iVar44 < auVar22._0_4_);
      iVar43 = auVar23._4_4_;
      auVar37._4_4_ = -(uint)(iVar43 < auVar22._4_4_);
      iVar54 = auVar23._8_4_;
      iVar55 = -(uint)(iVar54 < auVar22._8_4_);
      iVar53 = auVar23._12_4_;
      auVar37._12_4_ = -(uint)(iVar53 < auVar22._12_4_);
      auVar49._4_4_ = iVar56;
      auVar49._0_4_ = iVar56;
      auVar49._8_4_ = iVar55;
      auVar49._12_4_ = iVar55;
      auVar27 = pshuflw(in_XMM11,auVar49,0xe8);
      auVar36._4_4_ = -(uint)(auVar22._4_4_ == iVar43);
      auVar36._12_4_ = -(uint)(auVar22._12_4_ == iVar53);
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar35 = pshuflw(in_XMM12,auVar36,0xe8);
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar22 = pshuflw(auVar27,auVar37,0xe8);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar22 | auVar35 & auVar27) ^ auVar62;
      auVar22 = packssdw(auVar62,auVar62);
      if ((auVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + uVar21 * 2) = uVar17;
      }
      auVar37 = auVar36 & auVar49 | auVar37;
      auVar22 = packssdw(auVar37,auVar37);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar4,auVar22 ^ auVar4);
      if ((auVar22._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)(lVar9 + 2 + uVar21 * 2) = uVar17;
      }
      auVar22 = (auVar25 | auVar15) ^ auVar12;
      iVar56 = -(uint)(iVar44 < auVar22._0_4_);
      auVar58._4_4_ = -(uint)(iVar43 < auVar22._4_4_);
      iVar55 = -(uint)(iVar54 < auVar22._8_4_);
      auVar58._12_4_ = -(uint)(iVar53 < auVar22._12_4_);
      auVar38._4_4_ = iVar56;
      auVar38._0_4_ = iVar56;
      auVar38._8_4_ = iVar55;
      auVar38._12_4_ = iVar55;
      auVar50._4_4_ = -(uint)(auVar22._4_4_ == iVar43);
      auVar50._12_4_ = -(uint)(auVar22._12_4_ == iVar53);
      auVar50._0_4_ = auVar50._4_4_;
      auVar50._8_4_ = auVar50._12_4_;
      auVar58._0_4_ = auVar58._4_4_;
      auVar58._8_4_ = auVar58._12_4_;
      auVar22 = auVar50 & auVar38 | auVar58;
      auVar22 = packssdw(auVar22,auVar22);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar5,auVar22 ^ auVar5);
      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 4 + uVar21 * 2) = uVar17;
      }
      auVar30 = pshufhw(auVar38,auVar38,0x84);
      auVar46 = pshufhw(auVar50,auVar50,0x84);
      auVar28 = pshufhw(auVar30,auVar58,0x84);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar28 | auVar46 & auVar30) ^ auVar39;
      auVar30 = packssdw(auVar39,auVar39);
      if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 6 + uVar21 * 2) = uVar17;
      }
      auVar30 = (auVar25 | auVar14) ^ auVar12;
      iVar56 = -(uint)(iVar44 < auVar30._0_4_);
      auVar41._4_4_ = -(uint)(iVar43 < auVar30._4_4_);
      iVar55 = -(uint)(iVar54 < auVar30._8_4_);
      auVar41._12_4_ = -(uint)(iVar53 < auVar30._12_4_);
      auVar51._4_4_ = iVar56;
      auVar51._0_4_ = iVar56;
      auVar51._8_4_ = iVar55;
      auVar51._12_4_ = iVar55;
      auVar22 = pshuflw(auVar22,auVar51,0xe8);
      auVar40._4_4_ = -(uint)(auVar30._4_4_ == iVar43);
      auVar40._12_4_ = -(uint)(auVar30._12_4_ == iVar53);
      auVar40._0_4_ = auVar40._4_4_;
      auVar40._8_4_ = auVar40._12_4_;
      auVar27 = pshuflw(auVar35 & auVar27,auVar40,0xe8);
      in_XMM12 = auVar27 & auVar22;
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar22 = pshuflw(auVar22,auVar41,0xe8);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar63 = (auVar22 | in_XMM12) ^ auVar63;
      in_XMM11 = packssdw(auVar63,auVar63);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 8 + uVar21 * 2) = uVar17;
      }
      auVar41 = auVar40 & auVar51 | auVar41;
      auVar22 = packssdw(auVar41,auVar41);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar6,auVar22 ^ auVar6);
      if ((auVar22 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 10 + uVar21 * 2) = uVar17;
      }
      auVar22 = (auVar25 | auVar13) ^ auVar12;
      iVar44 = -(uint)(iVar44 < auVar22._0_4_);
      auVar52._4_4_ = -(uint)(iVar43 < auVar22._4_4_);
      iVar54 = -(uint)(iVar54 < auVar22._8_4_);
      auVar52._12_4_ = -(uint)(iVar53 < auVar22._12_4_);
      auVar42._4_4_ = iVar44;
      auVar42._0_4_ = iVar44;
      auVar42._8_4_ = iVar54;
      auVar42._12_4_ = iVar54;
      auVar26._4_4_ = -(uint)(auVar22._4_4_ == iVar43);
      auVar26._12_4_ = -(uint)(auVar22._12_4_ == iVar53);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar52._0_4_ = auVar52._4_4_;
      auVar52._8_4_ = auVar52._12_4_;
      auVar22 = auVar26 & auVar42 | auVar52;
      auVar22 = packssdw(auVar22,auVar22);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 ^ auVar7,auVar22 ^ auVar7);
      if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 0xc + uVar21 * 2) = uVar17;
      }
      auVar27 = pshufhw(auVar42,auVar42,0x84);
      auVar22 = pshufhw(auVar26,auVar26,0x84);
      auVar35 = pshufhw(auVar27,auVar52,0x84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar22 = packssdw(auVar22 & auVar27,(auVar35 | auVar22 & auVar27) ^ auVar8);
      if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)(lVar9 + 0xe + uVar21 * 2) = uVar17;
      }
      uVar21 = uVar21 + 8;
    } while ((lVar19 + 7U & 0xfffffffffffffff8) != uVar21);
    __s = (uint8_t *)(lVar9 + lVar19 * 2);
    sVar18 = lVar19 * 2;
  }
  memset(__s,0,sVar18);
LAB_007b69d0:
  local_40.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  local_40.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  iVar44 = (this->params_).width;
  local_40.pre_fpu_env_[4] = in_FPUTagWord;
  local_44 = (*(this->params_).func)(this->src_,iVar44,this->ref_,iVar44,&local_1c);
  libaom_test::RegisterStateCheckMMX::Check(&local_40);
  iVar43 = (this->params_).block_size * 0xfe01;
  iVar44 = iVar43 + 3;
  if (-1 < iVar43) {
    iVar44 = iVar43;
  }
  local_20 = iVar44 >> 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_40,"expected","var",&local_20,&local_44);
  if (local_40.pre_fpu_env_[0]._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_50);
    puVar10 = (undefined8 *)
              CONCAT44(local_40.pre_fpu_env_._12_4_,
                       CONCAT22(local_40.pre_fpu_env_[5],local_40.pre_fpu_env_[4]));
    if (puVar10 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar10;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x308,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_50.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_50.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  puVar10 = (undefined8 *)
            CONCAT44(local_40.pre_fpu_env_._12_4_,
                     CONCAT22(local_40.pre_fpu_env_[5],local_40.pre_fpu_env_[4]));
  if (puVar10 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar10 != puVar10 + 2) {
      operator_delete((undefined8 *)*puVar10);
    }
    operator_delete(puVar10);
  }
  return;
}

Assistant:

void MainTestClass<VarianceFunctionType>::OneQuarterTest() {
  const int half = block_size() / 2;
  if (!use_high_bit_depth()) {
    memset(src_, 255, block_size());
    memset(ref_, 255, half);
    memset(ref_ + half, 0, half);
  } else {
    aom_memset16(CONVERT_TO_SHORTPTR(src_), 255 << byte_shift(), block_size());
    aom_memset16(CONVERT_TO_SHORTPTR(ref_), 255 << byte_shift(), half);
    aom_memset16(CONVERT_TO_SHORTPTR(ref_) + half, 0, half);
  }
  unsigned int sse, var, expected;
  API_REGISTER_STATE_CHECK(
      var = params_.func(src_, width(), ref_, width(), &sse));
  expected = block_size() * 255 * 255 / 4;
  EXPECT_EQ(expected, var);
}